

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::assessPossiblyDualUnbounded(HEkkDual *this)

{
  bool bVar1;
  
  if ((this->solve_phase == 2) && ((this->ekk_instance_->status_).has_fresh_rebuild == true)) {
    bVar1 = proofOfPrimalInfeasibility(this);
    if (bVar1) {
      this->solve_phase = -2;
      saveDualRay(this);
      this->ekk_instance_->model_status_ = kInfeasible;
    }
    else {
      HEkk::addBadBasisChange
                (this->ekk_instance_,this->row_out,this->variable_out,this->variable_in,
                 kFailedInfeasibilityProof,true);
      this->rebuild_reason = 0;
    }
  }
  return;
}

Assistant:

void HEkkDual::assessPossiblyDualUnbounded() {
  assert(rebuild_reason == kRebuildReasonPossiblyDualUnbounded);
  if (solve_phase != kSolvePhase2) return;
  if (!ekk_instance_.status_.has_fresh_rebuild) return;
  // Appears to be dual unbounded in phase 2 after fresh
  // rebuild. Normally this implies primal infeasibility, but only
  // allow this to be claimed if the proof of primal infeasibility
  // is true.
  //
  const bool proof_of_infeasibility = proofOfPrimalInfeasibility();
  if (proof_of_infeasibility) {
    // There is a proof of primal infeasibility
    solve_phase = kSolvePhaseExit;
    // Save dual ray information
    saveDualRay();
    // Model status should be unset?
    assert(ekk_instance_.model_status_ == HighsModelStatus::kNotset);
    ekk_instance_.model_status_ = HighsModelStatus::kInfeasible;
  } else {
    // No proof of primal infeasibility, so assume dual unbounded
    // claim is spurious. Make row_out taboo, and prevent rebuild
    ekk_instance_.addBadBasisChange(
        row_out, variable_out, variable_in,
        BadBasisChangeReason::kFailedInfeasibilityProof, true);
    rebuild_reason = kRebuildReasonNo;
  }
}